

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9918.cpp
# Opt level: O3

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)0>::write_register
          (Base<(TI::TMS::Personality)0> *this,uint8_t value)

{
  if (this->write_phase_ == false) {
    this->low_write_ = value;
    this->write_phase_ = true;
    this->ram_pointer_ = (ushort)value | this->ram_pointer_ & 0x3f00;
    return;
  }
  *(byte *)((long)&this->ram_pointer_ + 1) = value & 0x3f;
  this->write_phase_ = false;
  if (-1 < (char)value) {
    if (value < 0x40) {
      this->queued_access_ = Read;
      this->minimum_access_column_ = (this->fetch_pointer_).column + 6;
    }
    return;
  }
  commit_register(this,(uint)value,this->low_write_);
  return;
}

Assistant:

void Base<personality>::write_register(uint8_t value) {
	// Writes to address 1 are performed in pairs; if this is the
	// low byte of a value, store it and wait for the high byte.
	if(!write_phase_) {
		low_write_ = value;
		write_phase_ = true;

		// The initial write should half update the access pointer, other than
		// on the Yamaha.
		if constexpr (!is_yamaha_vdp(personality)) {
			install_field<0>(ram_pointer_, value);
		}
		return;
	}

	// The RAM pointer is always set on a second write, regardless of
	// whether the caller is intending to enqueue a VDP operation.
	// If this isn't a Yamaha VDP then the RAM address is updated
	// regardless of whether this turns out to be a register access.
	//
	// The top two bits are used to determine the type of write; only
	// the lower six are actual address.
	if constexpr (!is_yamaha_vdp(personality)) {
		install_field<8, 6>(ram_pointer_, value);
	}

	write_phase_ = false;
	if(value & 0x80) {
		commit_register(value, low_write_);
	} else {
		// This is an access via the RAM pointer; if this is a Yamaha VDP then update
		// the low 14-bits of the RAM pointer now.
		if constexpr (is_yamaha_vdp(personality)) {
			install_field<0>(ram_pointer_, low_write_);
			install_field<8, 6>(ram_pointer_, value);
		}

		if(!(value & 0x40)) {
			// A read request is enqueued upon setting the address; conversely a write
			// won't be enqueued unless and until some actual data is supplied.
			queued_access_ = MemoryAccess::Read;
			minimum_access_column_ = fetch_pointer_.column + LineLayout<personality>::VRAMAccessDelay;
		}

		if constexpr (is_sega_vdp(personality)) {
			Storage<personality>::cram_is_selected_ = false;
		}
	}
}